

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

void __thiscall
Imf_3_4::
TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~TypedAttribute(TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this)

{
  (this->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e42c0;
  std::__cxx11::string::~string((string *)&this->_value);
  Attribute::~Attribute(&this->super_Attribute);
  return;
}

Assistant:

TypedAttribute<T>::~TypedAttribute ()
{
    // empty
}